

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void dc_predictor_rect(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
                      int shift1,int multiplier)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  int r;
  int expected_dc;
  int i_1;
  int i;
  int sum;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    local_2c = (uint)*(byte *)(in_R8 + local_30) + local_2c;
  }
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    local_2c = (uint)*(byte *)(in_R9 + local_34) + local_2c;
  }
  uVar1 = divide_using_multiply_shift
                    (local_2c + (in_EDX + in_ECX >> 1),in_stack_00000008,expected_dc,0x10);
  local_8 = in_RDI;
  for (local_3c = 0; local_3c < in_ECX; local_3c = local_3c + 1) {
    memset(local_8,uVar1 & 0xff,(long)in_EDX);
    local_8 = (void *)(in_RSI + (long)local_8);
  }
  return;
}

Assistant:

static inline void dc_predictor_rect(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left, int shift1,
                                     int multiplier) {
  int sum = 0;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, DC_SHIFT2);
  assert(expected_dc < (1 << 8));

  for (int r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}